

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSX.cpp
# Opt level: O0

void __thiscall
MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>::~ConcreteMachine
          (ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true> *this)

{
  HandledSlot *local_20;
  ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true> *this_local;
  
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__ConcreteMachine_00ca14a8;
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_00ca1570;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&DAT_00ca15b8;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR_set_scan_target_00ca15d0;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&DAT_00ca1608;
  (this->super_MappedKeyboardMachine).super_Delegate._vptr_Delegate = (_func_int **)&DAT_00ca1620;
  (this->super_MappedKeyboardMachine).super_KeyboardMachine.super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_00ca1650;
  (this->super_JoystickMachine)._vptr_JoystickMachine = (_func_int **)&DAT_00ca1690;
  (this->super_Device)._vptr_Device = (_func_int **)&PTR_set_options_00ca16a8;
  (this->super_Observer)._vptr_Observer = (_func_int **)&DAT_00ca16c8;
  (this->super_Source)._vptr_Source = (_func_int **)&DAT_00ca16e0;
  (this->super_MemorySlotChangeHandler)._vptr_MemorySlotChangeHandler = (_func_int **)&DAT_00ca16f8;
  Concurrency::AsyncTaskQueue<false,_true,_void>::flush(&(this->speaker_).audio_queue);
  std::__cxx11::string::~string((string *)&this->input_text_);
  local_20 = (HandledSlot *)&this->final_slot_;
  do {
    local_20 = local_20 + -1;
    HandledSlot::~HandledSlot(local_20);
  } while (local_20 != this->memory_slots_);
  AYPortHandler::~AYPortHandler(&this->ay_port_handler_);
  Speaker<true>::~Speaker(&this->speaker_);
  Storage::Tape::BinaryTapePlayer::~BinaryTapePlayer(&this->tape_player_);
  JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::~JustInTimeActor
            (&this->vdp_);
  CPU::Z80::
  Processor<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>,_false,_false>::
  ~Processor(&this->z80_);
  MachineTypes::MappedKeyboardMachine::~MappedKeyboardMachine(&this->super_MappedKeyboardMachine);
  MSX::Machine::~Machine(&this->super_Machine);
  return;
}

Assistant:

~ConcreteMachine() {
			speaker_.audio_queue.flush();
		}